

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::optimizeMemoryFill(OptimizeInstructions *this,MemoryFill *memFill)

{
  Expression *pEVar1;
  Expression *value_00;
  bool bVar2;
  Module *pMVar3;
  OptimizeInstructions *pOVar4;
  Function *func;
  LocalSet *ptr;
  Const *pCVar5;
  LocalGet *ptr_00;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  Type local_200;
  Address local_1f8 [2];
  optional<wasm::Type> local_1e8;
  size_t local_1d8;
  char *local_1d0;
  Type local_1c8;
  uintptr_t local_1c0;
  Address local_1b8;
  size_t local_1b0;
  char *local_1a8;
  Type local_1a0;
  uintptr_t local_198;
  Address local_190;
  Store *local_188;
  Store *local_180;
  initializer_list<wasm::Expression_*> local_178;
  uintptr_t local_168;
  Index local_15c;
  Type TStack_158;
  Index tempLocal;
  Type destType;
  Type local_140;
  Address local_138;
  uchar local_129;
  uchar local_128 [8];
  uint8_t values [16];
  Type local_108;
  Address local_100;
  size_t local_f8;
  char *local_f0;
  Type local_e8;
  Address local_e0;
  size_t local_d8;
  char *local_d0;
  Type local_c8;
  Address local_c0;
  size_t local_b8;
  char *local_b0;
  Type local_a8;
  Address local_a0;
  uint local_94;
  Const *pCStack_90;
  uint32_t value;
  Const *cvalue;
  undefined4 local_80;
  uint32_t align;
  uint32_t offset;
  undefined1 local_70;
  Drop *local_68;
  Drop *local_60;
  initializer_list<wasm::Expression_*> local_58;
  int64_t local_48;
  int64_t bytes;
  Const *csize;
  Builder builder;
  PassOptions *options;
  MemoryFill *local_20;
  MemoryFill *memFill_local;
  OptimizeInstructions *this_local;
  
  options._4_4_ = 1;
  local_20 = memFill;
  memFill_local = (MemoryFill *)this;
  bVar2 = wasm::Type::operator==
                    (&(memFill->super_SpecificExpression<(wasm::Expression::Id)39>).super_Expression
                      .type,(BasicType *)((long)&options + 4));
  if (bVar2) {
    return (Expression *)(OptimizeInstructions *)0x0;
  }
  bVar2 = Expression::is<wasm::Const>(local_20->size);
  if (!bVar2) {
    return (Expression *)(OptimizeInstructions *)0x0;
  }
  builder.wasm = (Module *)Pass::getPassOptions((Pass *)this);
  pMVar3 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
           getModule(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                      ).
                      super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      .
                      super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    );
  Builder::Builder((Builder *)&csize,pMVar3);
  bytes = (int64_t)Expression::cast<wasm::Const>(local_20->size);
  local_48 = wasm::Literal::getInteger(&((Const *)bytes)->value);
  if ((local_48 == 0) &&
     ((((ulong)((builder.wasm)->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish & 1) != 0 ||
      (((ulong)((builder.wasm)->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish & 0x100) != 0)))) {
    local_68 = Builder::makeDrop((Builder *)&csize,local_20->dest);
    local_60 = Builder::makeDrop((Builder *)&csize,local_20->value);
    local_58._M_array = (iterator)&local_68;
    local_58._M_len = 2;
    std::optional<wasm::Type>::optional((optional<wasm::Type> *)&offset);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)_offset;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_70;
    pOVar4 = (OptimizeInstructions *)Builder::makeBlock((Builder *)&csize,&local_58,type);
    return (Expression *)pOVar4;
  }
  local_80 = 0;
  cvalue._4_4_ = 1;
  pCStack_90 = Expression::dynCast<wasm::Const>(local_20->value);
  if (pCStack_90 == (Const *)0x0) goto LAB_01f7cf02;
  local_94 = wasm::Literal::geti32(&pCStack_90->value);
  local_94 = local_94 & 0xff;
  if (local_48 - 1U < 0xf || local_48 == 0x10) {
    switch((long)&switchD_01f7c877::switchdataD_0290db60 +
           (long)(int)(&switchD_01f7c877::switchdataD_0290db60)[local_48 - 1U]) {
    case 0x1f7c879:
      wasm::Address::Address(&local_a0,0);
      pEVar1 = local_20->dest;
      pCVar5 = Builder::makeConst<unsigned_int>((Builder *)&csize,local_94);
      wasm::Type::Type(&local_a8,i32);
      local_b8 = (local_20->memory).super_IString.str._M_len;
      local_b0 = (local_20->memory).super_IString.str._M_str;
      pOVar4 = (OptimizeInstructions *)
               Builder::makeStore((Builder *)&csize,1,local_a0,1,pEVar1,(Expression *)pCVar5,
                                  local_a8,(Name)(local_20->memory).super_IString.str);
      return (Expression *)pOVar4;
    case 0x1f7c92a:
      wasm::Address::Address(&local_c0,0);
      pEVar1 = local_20->dest;
      pCVar5 = Builder::makeConst<unsigned_int>((Builder *)&csize,local_94 * 0x101);
      wasm::Type::Type(&local_c8,i32);
      local_d8 = (local_20->memory).super_IString.str._M_len;
      local_d0 = (local_20->memory).super_IString.str._M_str;
      pOVar4 = (OptimizeInstructions *)
               Builder::makeStore((Builder *)&csize,2,local_c0,1,pEVar1,(Expression *)pCVar5,
                                  local_c8,(Name)(local_20->memory).super_IString.str);
      return (Expression *)pOVar4;
    case 0x1f7c9e2:
      if ((local_94 == 0) ||
         (*(int *)&((builder.wasm)->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish == 0)) {
        wasm::Address::Address(&local_e0,0);
        pEVar1 = local_20->dest;
        pCVar5 = Builder::makeConst<unsigned_int>((Builder *)&csize,local_94 * 0x1010101);
        wasm::Type::Type(&local_e8,i32);
        local_f8 = (local_20->memory).super_IString.str._M_len;
        local_f0 = (local_20->memory).super_IString.str._M_str;
        pOVar4 = (OptimizeInstructions *)
                 Builder::makeStore((Builder *)&csize,4,local_e0,1,pEVar1,(Expression *)pCVar5,
                                    local_e8,(Name)(local_20->memory).super_IString.str);
        return (Expression *)pOVar4;
      }
      break;
    case 0x1f7cab6:
      if ((local_94 == 0) ||
         (*(int *)&((builder.wasm)->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish == 0)) {
        wasm::Address::Address(&local_100,0);
        pEVar1 = local_20->dest;
        pCVar5 = Builder::makeConst<unsigned_long>
                           ((Builder *)&csize,(ulong)local_94 * 0x101010101010101);
        wasm::Type::Type(&local_108,i64);
        values._8_8_ = (local_20->memory).super_IString.str._M_len;
        pOVar4 = (OptimizeInstructions *)
                 Builder::makeStore((Builder *)&csize,8,local_100,1,pEVar1,(Expression *)pCVar5,
                                    local_108,(Name)(local_20->memory).super_IString.str);
        return (Expression *)pOVar4;
      }
      break;
    case 0x1f7cb96:
      if (*(int *)&((builder.wasm)->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish == 0) {
        pMVar3 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 ::getModule(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                              ).
                              super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              .
                              super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            );
        bVar2 = FeatureSet::hasSIMD(&pMVar3->features);
        if (!bVar2) {
          TStack_158.id = (local_20->dest->type).id;
          func = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 ::getFunction(&(this->
                                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                ).
                                super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                .
                                super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              );
          local_168 = TStack_158.id;
          local_15c = Builder::addVar(func,TStack_158);
          wasm::Address::Address(&local_190,0);
          local_198 = TStack_158.id;
          ptr = Builder::makeLocalTee((Builder *)&csize,local_15c,local_20->dest,TStack_158);
          pCVar5 = Builder::makeConst<unsigned_long>
                             ((Builder *)&csize,(ulong)local_94 * 0x101010101010101);
          wasm::Type::Type(&local_1a0,i64);
          local_1b0 = (local_20->memory).super_IString.str._M_len;
          local_1a8 = (local_20->memory).super_IString.str._M_str;
          local_188 = Builder::makeStore((Builder *)&csize,8,local_190,1,(Expression *)ptr,
                                         (Expression *)pCVar5,local_1a0,
                                         (Name)(local_20->memory).super_IString.str);
          wasm::Address::Address(&local_1b8,8);
          local_1c0 = TStack_158.id;
          ptr_00 = Builder::makeLocalGet((Builder *)&csize,local_15c,TStack_158);
          pCVar5 = Builder::makeConst<unsigned_long>
                             ((Builder *)&csize,(ulong)local_94 * 0x101010101010101);
          wasm::Type::Type(&local_1c8,i64);
          local_1d8 = (local_20->memory).super_IString.str._M_len;
          local_1d0 = (local_20->memory).super_IString.str._M_str;
          local_180 = Builder::makeStore((Builder *)&csize,8,local_1b8,1,(Expression *)ptr_00,
                                         (Expression *)pCVar5,local_1c8,
                                         (Name)(local_20->memory).super_IString.str);
          local_178._M_array = (iterator)&local_188;
          local_178._M_len = 2;
          std::optional<wasm::Type>::optional(&local_1e8);
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._9_7_ = 0;
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               local_1e8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_payload;
          type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_engaged =
               local_1e8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_engaged;
          pOVar4 = (OptimizeInstructions *)Builder::makeBlock((Builder *)&csize,&local_178,type_00);
          return (Expression *)pOVar4;
        }
        local_129 = (uchar)local_94;
        std::fill_n<unsigned_char*,int,unsigned_char>(local_128,0x10,&local_129);
        wasm::Address::Address(&local_138,0);
        pEVar1 = local_20->dest;
        pCVar5 = Builder::makeConst<unsigned_char[16]>((Builder *)&csize,local_128);
        wasm::Type::Type(&local_140,v128);
        destType.id = (local_20->memory).super_IString.str._M_len;
        pOVar4 = (OptimizeInstructions *)
                 Builder::makeStore((Builder *)&csize,0x10,local_138,1,pEVar1,(Expression *)pCVar5,
                                    local_140,(Name)(local_20->memory).super_IString.str);
        return (Expression *)pOVar4;
      }
      break;
    case 0x1f7cefe:
      goto switchD_01f7c877_caseD_1f7cefe;
    }
  }
  else {
switchD_01f7c877_caseD_1f7cefe:
  }
LAB_01f7cf02:
  if (local_48 == 1) {
    wasm::Address::Address(local_1f8,0);
    pEVar1 = local_20->dest;
    value_00 = local_20->value;
    wasm::Type::Type(&local_200,i32);
    this_local = (OptimizeInstructions *)
                 Builder::makeStore((Builder *)&csize,1,local_1f8[0],1,pEVar1,value_00,local_200,
                                    (Name)(local_20->memory).super_IString.str);
  }
  else {
    this_local = (OptimizeInstructions *)0x0;
  }
  return (Expression *)this_local;
}

Assistant:

Expression* optimizeMemoryFill(MemoryFill* memFill) {
    if (memFill->type == Type::unreachable) {
      return nullptr;
    }

    if (!memFill->size->is<Const>()) {
      return nullptr;
    }

    auto& options = getPassOptions();
    Builder builder(*getModule());

    auto* csize = memFill->size->cast<Const>();
    auto bytes = csize->value.getInteger();

    if (bytes == 0LL &&
        (options.ignoreImplicitTraps || options.trapsNeverHappen)) {
      // memory.fill(d, v, 0)  ==>  { drop(d), drop(v) }
      return builder.makeBlock(
        {builder.makeDrop(memFill->dest), builder.makeDrop(memFill->value)});
    }

    const uint32_t offset = 0, align = 1;

    if (auto* cvalue = memFill->value->dynCast<Const>()) {
      uint32_t value = cvalue->value.geti32() & 0xFF;
      // memory.fill(d, C1, C2)  ==>
      //   store(d, (C1 & 0xFF) * (-1U / max(bytes)))
      switch (bytes) {
        case 1: {
          return builder.makeStore(1, // bytes
                                   offset,
                                   align,
                                   memFill->dest,
                                   builder.makeConst<uint32_t>(value),
                                   Type::i32,
                                   memFill->memory);
        }
        case 2: {
          return builder.makeStore(2,
                                   offset,
                                   align,
                                   memFill->dest,
                                   builder.makeConst<uint32_t>(value * 0x0101U),
                                   Type::i32,
                                   memFill->memory);
        }
        case 4: {
          // transform only when "value" or shrinkLevel equal to zero due to
          // it could increase size by several bytes
          if (value == 0 || options.shrinkLevel == 0) {
            return builder.makeStore(
              4,
              offset,
              align,
              memFill->dest,
              builder.makeConst<uint32_t>(value * 0x01010101U),
              Type::i32,
              memFill->memory);
          }
          break;
        }
        case 8: {
          // transform only when "value" or shrinkLevel equal to zero due to
          // it could increase size by several bytes
          if (value == 0 || options.shrinkLevel == 0) {
            return builder.makeStore(
              8,
              offset,
              align,
              memFill->dest,
              builder.makeConst<uint64_t>(value * 0x0101010101010101ULL),
              Type::i64,
              memFill->memory);
          }
          break;
        }
        case 16: {
          if (options.shrinkLevel == 0) {
            if (getModule()->features.hasSIMD()) {
              uint8_t values[16];
              std::fill_n(values, 16, (uint8_t)value);
              return builder.makeStore(16,
                                       offset,
                                       align,
                                       memFill->dest,
                                       builder.makeConst<uint8_t[16]>(values),
                                       Type::v128,
                                       memFill->memory);
            } else {
              // { i64.store(d, C', 0), i64.store(d, C', 8) }
              auto destType = memFill->dest->type;
              Index tempLocal = builder.addVar(getFunction(), destType);
              return builder.makeBlock({
                builder.makeStore(
                  8,
                  offset,
                  align,
                  builder.makeLocalTee(tempLocal, memFill->dest, destType),
                  builder.makeConst<uint64_t>(value * 0x0101010101010101ULL),
                  Type::i64,
                  memFill->memory),
                builder.makeStore(
                  8,
                  offset + 8,
                  align,
                  builder.makeLocalGet(tempLocal, destType),
                  builder.makeConst<uint64_t>(value * 0x0101010101010101ULL),
                  Type::i64,
                  memFill->memory),
              });
            }
          }
          break;
        }
        default: {
        }
      }
    }
    // memory.fill(d, v, 1)  ==>  store8(d, v)
    if (bytes == 1LL) {
      return builder.makeStore(1,
                               offset,
                               align,
                               memFill->dest,
                               memFill->value,
                               Type::i32,
                               memFill->memory);
    }

    return nullptr;
  }